

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,char *error)

{
  char *__s;
  bool bVar1;
  Token *pTVar2;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *error_local;
  string *output_local;
  Parser *this_local;
  
  local_28 = error;
  error_local = (char *)output;
  output_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
  __s = local_28;
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)error_local,(string *)&pTVar2->text);
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return bVar1;
}

Assistant:

bool Parser::ConsumeIdentifier(string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}